

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::MethodDescriptorProto::SharedCtor(MethodDescriptorProto *this,Arena *arena)

{
  Arena *arena_local;
  MethodDescriptorProto *this_local;
  
  MessageLite::internal_visibility();
  Impl_::Impl_((Impl_ *)&this->field_0);
  memset((void *)((long)&this->field_0 + 0x20),0,10);
  return;
}

Assistant:

inline void MethodDescriptorProto::SharedCtor(::_pb::Arena* PROTOBUF_NULLABLE arena) {
  new (&_impl_) Impl_(internal_visibility(), arena);
  ::memset(reinterpret_cast<char *>(&_impl_) +
               offsetof(Impl_, options_),
           0,
           offsetof(Impl_, server_streaming_) -
               offsetof(Impl_, options_) +
               sizeof(Impl_::server_streaming_));
}